

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  uint32_t *puVar5;
  int iVar6;
  byte bVar7;
  Command *pCVar8;
  uint32_t uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  long lVar18;
  byte bVar19;
  uint8_t *local_8d0;
  uint8_t *local_8c0;
  uint8_t *local_8b0;
  uint8_t *local_8a8;
  uint8_t *local_898;
  uint8_t *local_880;
  uint8_t *local_868;
  ulong local_860;
  ulong local_858;
  uint8_t *local_840;
  uint8_t *local_838;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_7c8;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H3 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_630;
  uint32_t delta;
  size_t nbits;
  size_t offset;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_51a;
  uint32_t nbits_2;
  ushort local_4f2;
  uint32_t offset_1;
  uint16_t bits64;
  ushort local_4ca;
  size_t score_3;
  size_t backward_1;
  size_t len_3;
  size_t i_1;
  size_t keys_1 [2];
  size_t score_2;
  size_t len_2;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t key_out_1;
  size_t key_1;
  int compare_char_1;
  size_t cur_ix_masked_1;
  size_t best_len_in_1;
  uint32_t *buckets_1;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_370;
  size_t local_360;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_330;
  size_t local_320;
  size_t score_1;
  size_t backward;
  size_t len_1;
  size_t i;
  size_t keys [2];
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t key_out;
  size_t key;
  int compare_char;
  size_t cur_ix_masked;
  size_t best_len_in;
  uint32_t *buckets;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_188;
  size_t local_178;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_148;
  size_t local_138;
  uint8_t *local_d0;
  size_t i_2;
  uint32_t off;
  uint32_t key_2;
  uint32_t off_2;
  uint32_t key_4;
  uint32_t off_1;
  uint32_t key_3;
  
  pCVar8 = commands;
  puVar11 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar4 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar12 = (uint8_t *)(position + num_bytes);
  local_838 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_838 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar10 = 0x200;
  if (params->quality < 9) {
    iVar10 = 0x40;
  }
  lVar13 = (long)iVar10;
  gap = position + lVar13;
  puVar16 = (uint8_t *)position;
LAB_00104ae8:
  do {
    ringbuffer_local = puVar16;
    if (puVar12 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar12 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar8 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar12 - (long)ringbuffer_local;
    local_840 = puVar11;
    if (ringbuffer_local < puVar11) {
      local_840 = ringbuffer_local;
    }
    sr.len = 0;
    sr.score = 0;
    puVar5 = (hasher->privat)._H2.buckets_;
    cached_backward = 0;
    uVar14 = (ulong)ringbuffer_local & ringbuffer_mask;
    uVar1 = ringbuffer[uVar14];
    uVar9 = HashBytesH3(ringbuffer + uVar14);
    best_len = 0x7e4;
    sr.score._0_4_ = 0;
    if ((ringbuffer_local + -(long)*dist_cache < ringbuffer_local) &&
       (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(ringbuffer_local + -(long)*dist_cache),
       uVar1 == ringbuffer[uVar15])) {
      local_148 = (ulong *)(ringbuffer + uVar14);
      limit2 = 0;
      x = (max_distance >> 3) + 1;
LAB_00104e57:
      x = x - 1;
      if (x != 0) {
        if (*local_148 == *(ulong *)(ringbuffer + limit2 + uVar15)) break;
        iVar10 = 0;
        for (uVar15 = *local_148 ^ *(ulong *)(ringbuffer + limit2 + uVar15); (uVar15 & 1) == 0;
            uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          iVar10 = iVar10 + 1;
        }
        local_138 = ((ulong)(long)iVar10 >> 3) + limit2;
        goto LAB_00104ffa;
      }
      matched = (max_distance & 7) + 1;
      while (matched = matched - 1, matched != 0) {
        if (ringbuffer[limit2 + uVar15] != (uint8_t)*local_148) {
          local_138 = limit2;
          goto LAB_00104ffa;
        }
        local_148 = (ulong *)((long)local_148 + 1);
        limit2 = limit2 + 1;
      }
      local_138 = limit2;
LAB_00104ffa:
      if (3 < local_138) {
        keys[1] = local_138 * 0x87 + 0x78f;
        if (0x7e4 < keys[1]) {
          cached_backward = local_138;
          uVar1 = ringbuffer[uVar14 + local_138];
          sr.len = (long)*dist_cache;
          best_len = keys[1];
        }
      }
    }
    for (len_1 = 0; len_1 < 2; len_1 = len_1 + 1) {
      keys[len_1 - 1] = (ulong)uVar9 + len_1 * 8 & 0xffff;
    }
    sStack_7c8 = cached_backward;
    sr.distance = best_len;
    for (len_1 = 0; len_1 < 2; len_1 = len_1 + 1) {
      uVar15 = (ulong)puVar5[keys[len_1 - 1]];
      puVar16 = ringbuffer_local + -uVar15;
      uVar15 = ringbuffer_mask & 0xffffffff & uVar15;
      if ((uVar1 == ringbuffer[uVar15 + cached_backward]) &&
         (puVar16 != (uint8_t *)0x0 && puVar16 <= local_840)) {
        local_188 = (ulong *)(ringbuffer + uVar14);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_00105258:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_188 == *(ulong *)(ringbuffer + limit2_1 + uVar15)) goto LAB_001052ba;
          iVar10 = 0;
          for (uVar15 = *local_188 ^ *(ulong *)(ringbuffer + limit2_1 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          local_178 = ((ulong)(long)iVar10 >> 3) + limit2_1;
          goto LAB_001053fb;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar15] != (uint8_t)*local_188) {
            local_178 = limit2_1;
            goto LAB_001053fb;
          }
          local_188 = (ulong *)((long)local_188 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_178 = limit2_1;
LAB_001053fb:
        if (3 < local_178) {
          iVar10 = 0x1f;
          if ((uint)puVar16 != 0) {
            for (; (uint)puVar16 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          uVar15 = (local_178 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
          if (best_len < uVar15) {
            cached_backward = local_178;
            sStack_7c8 = local_178;
            uVar1 = ringbuffer[uVar14 + local_178];
            sr.len = (size_t)puVar16;
            sr.distance = uVar15;
            best_len = uVar15;
          }
        }
      }
    }
    puVar5[*(long *)((long)keys + (((ulong)ringbuffer_local & 8) - 8))] = (uint32_t)ringbuffer_local
    ;
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar16 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_858 = sStack_7c8 - 1;
            if (max_distance <= local_858) {
              local_858 = max_distance;
            }
            local_860 = local_858;
          }
          else {
            local_860 = 0;
          }
          sr2.len = 0;
          local_868 = puVar11;
          if (ringbuffer_local + 1 < puVar11) {
            local_868 = ringbuffer_local + 1;
          }
          puVar16 = ringbuffer_local + 1;
          puVar5 = (hasher->privat)._H2.buckets_;
          cached_backward_1 = local_860;
          uVar14 = (ulong)puVar16 & ringbuffer_mask;
          uVar1 = ringbuffer[uVar14 + local_860];
          uVar9 = HashBytesH3(ringbuffer + uVar14);
          best_len_1 = 0x7e4;
          distance_code = 0;
          if ((puVar16 + -(long)*dist_cache < puVar16) &&
             (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(puVar16 + -(long)*dist_cache),
             uVar1 == ringbuffer[uVar15 + local_860])) {
            local_330 = (ulong *)(ringbuffer + uVar14);
            limit2_2 = 0;
            x_2 = (max_distance >> 3) + 1;
LAB_00105934:
            x_2 = x_2 - 1;
            if (x_2 != 0) {
              if (*local_330 == *(ulong *)(ringbuffer + limit2_2 + uVar15)) goto LAB_00105996;
              iVar10 = 0;
              for (uVar15 = *local_330 ^ *(ulong *)(ringbuffer + limit2_2 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar10 = iVar10 + 1;
              }
              local_320 = ((ulong)(long)iVar10 >> 3) + limit2_2;
              goto LAB_00105ad7;
            }
            matched_2 = (max_distance & 7) + 1;
            while (matched_2 = matched_2 - 1, matched_2 != 0) {
              if (ringbuffer[limit2_2 + uVar15] != (uint8_t)*local_330) {
                local_320 = limit2_2;
                goto LAB_00105ad7;
              }
              local_330 = (ulong *)((long)local_330 + 1);
              limit2_2 = limit2_2 + 1;
            }
            local_320 = limit2_2;
LAB_00105ad7:
            if ((3 < local_320) && (uVar15 = local_320 * 0x87 + 0x78f, 0x7e4 < uVar15)) {
              distance_code = local_320;
              cached_backward_1 = local_320;
              uVar1 = ringbuffer[uVar14 + local_320];
              sr2.len = (long)*dist_cache;
              best_len_1 = uVar15;
            }
          }
          for (len_3 = 0; len_3 < 2; len_3 = len_3 + 1) {
            keys_1[len_3 - 1] = (ulong)uVar9 + len_3 * 8 & 0xffff;
          }
          sr2.distance = best_len_1;
          for (len_3 = 0; len_3 < 2; len_3 = len_3 + 1) {
            uVar15 = (ulong)puVar5[keys_1[len_3 - 1]];
            puVar17 = puVar16 + -uVar15;
            uVar15 = ringbuffer_mask & 0xffffffff & uVar15;
            if ((uVar1 == ringbuffer[uVar15 + cached_backward_1]) &&
               (puVar17 != (uint8_t *)0x0 && puVar17 <= local_868)) {
              local_370 = (ulong *)(ringbuffer + uVar14);
              limit2_3 = 0;
              x_3 = (max_distance >> 3) + 1;
LAB_00105d35:
              x_3 = x_3 - 1;
              if (x_3 != 0) {
                if (*local_370 == *(ulong *)(ringbuffer + limit2_3 + uVar15)) goto LAB_00105d97;
                iVar10 = 0;
                for (uVar15 = *local_370 ^ *(ulong *)(ringbuffer + limit2_3 + uVar15);
                    (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                  iVar10 = iVar10 + 1;
                }
                local_360 = ((ulong)(long)iVar10 >> 3) + limit2_3;
                goto LAB_00105ed8;
              }
              matched_3 = (max_distance & 7) + 1;
              while (matched_3 = matched_3 - 1, matched_3 != 0) {
                if (ringbuffer[limit2_3 + uVar15] != (uint8_t)*local_370) {
                  local_360 = limit2_3;
                  goto LAB_00105ed8;
                }
                local_370 = (ulong *)((long)local_370 + 1);
                limit2_3 = limit2_3 + 1;
              }
              local_360 = limit2_3;
LAB_00105ed8:
              if (3 < local_360) {
                iVar10 = 0x1f;
                if ((uint)puVar17 != 0) {
                  for (; (uint)puVar17 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                uVar15 = (local_360 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                if (best_len_1 < uVar15) {
                  cached_backward_1 = local_360;
                  distance_code = local_360;
                  uVar1 = ringbuffer[uVar14 + local_360];
                  sr2.len = (size_t)puVar17;
                  sr2.distance = uVar15;
                  best_len_1 = uVar15;
                }
              }
            }
          }
          puVar5[*(long *)((long)keys_1 + (((ulong)puVar16 & 8) - 8))] = (uint32_t)puVar16;
          puVar16 = ringbuffer_local;
          if (sr2.distance < sr.distance + 0xaf) break;
          puVar16 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_7c8 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = 0;
          cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
          if ((3 < cost_diff_lazy._4_4_) ||
             (puVar17 = ringbuffer_local + 9, ringbuffer_local = puVar16, puVar12 <= puVar17))
          break;
        } while( true );
      }
      ringbuffer_local = puVar16;
      gap = (size_t)(ringbuffer_local + lVar13 + sStack_7c8 * 2);
      local_880 = puVar11;
      if (ringbuffer_local + sVar4 < puVar11) {
        local_880 = ringbuffer_local + sVar4;
      }
      if (local_880 < sr.len) {
LAB_001062e2:
        local_630 = sr.len + 0xf;
      }
      else {
        uVar14 = (sr.len + 3) - (long)*dist_cache;
        uVar15 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_630 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_630 = 1;
        }
        else if (uVar14 < 7) {
          local_630 = (ulong)(int)(0x9750468 >> ((byte)((uVar14 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar15 < 7) {
          local_630 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar15 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_630 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_001062e2;
          local_630 = 3;
        }
      }
      if ((sr.len <= local_880) && (local_630 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
      }
      uVar9 = (uint32_t)pos_end;
      commands->insert_len_ = uVar9;
      commands->copy_len_ = (uint)sStack_7c8 | (int)sr.score << 0x19;
      uVar2 = (params->dist).num_direct_distance_codes;
      uVar3 = (params->dist).distance_postfix_bits;
      if (local_630 < (ulong)uVar2 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_630;
        commands->dist_extra_ = 0;
      }
      else {
        bVar7 = (byte)uVar3;
        uVar14 = (1L << (bVar7 + 2 & 0x3f)) + ((local_630 - 0x10) - (ulong)uVar2);
        iVar10 = 0x1f;
        if ((uint)uVar14 != 0) {
          for (; (uint)uVar14 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        bVar19 = (byte)(iVar10 - 1U);
        uVar15 = uVar14 >> (bVar19 & 0x3f) & 1;
        lVar18 = (ulong)(iVar10 - 1U) - (ulong)uVar3;
        commands->dist_prefix_ =
             (short)lVar18 * 0x400 |
             (short)uVar2 + 0x10 + (short)((lVar18 + -1) * 2 + uVar15 << (bVar7 & 0x3f)) +
             ((ushort)uVar14 & (short)(1 << (bVar7 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar14 - (uVar15 + 2 << (bVar19 & 0x3f)) >> (bVar7 & 0x3f));
      }
      iVar10 = (uint)sStack_7c8 + (int)sr.score;
      uVar14 = (ulong)iVar10;
      if (pos_end < 6) {
        local_51a = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar6 = 0x1f;
        if (uVar9 - 2 != 0) {
          for (; uVar9 - 2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        local_51a = (short)(iVar6 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar6 + -1) & 0x3f)) +
                    2;
      }
      else if (pos_end < 0x842) {
        iVar6 = 0x1f;
        if (uVar9 - 0x42 != 0) {
          for (; uVar9 - 0x42 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        local_51a = (short)iVar6 + 10;
      }
      else if (pos_end < 0x1842) {
        local_51a = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_51a = 0x16;
      }
      else {
        local_51a = 0x17;
      }
      if (uVar14 < 10) {
        local_4f2 = (short)iVar10 - 2;
      }
      else if (uVar14 < 0x86) {
        iVar6 = 0x1f;
        if (iVar10 - 6U != 0) {
          for (; iVar10 - 6U >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        local_4f2 = (short)(iVar6 + -1) * 2 + (short)(uVar14 - 6 >> ((byte)(iVar6 + -1) & 0x3f)) + 4
        ;
      }
      else if (uVar14 < 0x846) {
        iVar6 = 0x1f;
        if (iVar10 - 0x46U != 0) {
          for (; iVar10 - 0x46U >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        local_4f2 = (short)iVar6 + 0xc;
      }
      else {
        local_4f2 = 0x17;
      }
      local_4ca = local_4f2 & 7 | (local_51a & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_51a < 8)) && (local_4f2 < 0x10)) {
        if (7 < local_4f2) {
          local_4ca = local_4ca | 0x40;
        }
      }
      else {
        iVar10 = ((int)(uint)local_4f2 >> 3) + ((int)(uint)local_51a >> 3) * 3;
        local_4ca = (short)iVar10 * 0x40 + 0x40 +
                    ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) | local_4ca;
      }
      commands->cmd_prefix_ = local_4ca;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_898 = ringbuffer_local + sStack_7c8;
      if (local_838 <= local_898) {
        local_898 = local_838;
      }
      if (sr.len < sStack_7c8 >> 2) {
        local_8a8 = ringbuffer_local + sr.len * -4 + sStack_7c8;
        if (local_8a8 < range_end) {
          local_8a8 = (uint8_t *)range_end;
        }
        if (local_898 < local_8a8) {
          local_8b0 = local_898;
        }
        else {
          local_8b0 = local_8a8;
        }
        range_end = (size_t)local_8b0;
      }
      for (local_d0 = (uint8_t *)range_end; local_d0 < local_898; local_d0 = local_d0 + 1) {
        uVar9 = HashBytesH3(ringbuffer + ((ulong)local_d0 & ringbuffer_mask));
        (hasher->privat)._H2.buckets_[uVar9 + ((uint)local_d0 & 8) & 0xffff] = (uint)local_d0;
      }
      commands = commands + 1;
      puVar16 = ringbuffer_local + sStack_7c8;
      goto LAB_00104ae8;
    }
    pos_end = pos_end + 1;
    puVar16 = ringbuffer_local + 1;
    if ((gap < puVar16) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar13 * 4) < puVar16) {
        puVar17 = ringbuffer_local + 0x11;
        local_8c0 = puVar12 + -7;
        ringbuffer_local = puVar16;
        if (puVar17 < local_8c0) {
          local_8c0 = puVar17;
        }
        for (; puVar16 = ringbuffer_local, ringbuffer_local < local_8c0;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar9 = HashBytesH3(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar9 + ((uint)ringbuffer_local & 8) & 0xffff] =
               (uint)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar17 = ringbuffer_local + 9;
        local_8d0 = puVar12 + -7;
        ringbuffer_local = puVar16;
        if (puVar17 < local_8d0) {
          local_8d0 = puVar17;
        }
        for (; puVar16 = ringbuffer_local, ringbuffer_local < local_8d0;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar9 = HashBytesH3(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar9 + ((uint)ringbuffer_local & 8) & 0xffff] =
               (uint)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
  local_148 = local_148 + 1;
  limit2 = limit2 + 8;
  goto LAB_00104e57;
LAB_001052ba:
  local_188 = local_188 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00105258;
LAB_00105996:
  local_330 = local_330 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00105934;
LAB_00105d97:
  local_370 = local_370 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00105d35;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}